

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *font_data,int font_data_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  void *in_RCX;
  ImFontConfig *in_RDI;
  float in_XMM0_Da;
  ImFontConfig font_cfg;
  float local_c4;
  undefined1 local_b8 [20];
  float local_a4;
  ImFontConfig *in_stack_ffffffffffffff88;
  ImFontAtlas *in_stack_ffffffffffffff90;
  
  if (in_RCX == (void *)0x0) {
    ImFontConfig::ImFontConfig(in_RDI);
  }
  else {
    memcpy(local_b8,in_RCX,0x90);
  }
  local_c4 = in_XMM0_Da;
  if (in_XMM0_Da <= 0.0) {
    local_c4 = local_a4;
  }
  local_a4 = local_c4;
  pIVar1 = AddFont(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* font_data, int font_data_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    IM_ASSERT(font_data_size > 100 && "Incorrect value for font_data_size!"); // Heuristic to prevent accidentally passing a wrong value to font_data_size.
    font_cfg.FontData = font_data;
    font_cfg.FontDataSize = font_data_size;
    font_cfg.SizePixels = size_pixels > 0.0f ? size_pixels : font_cfg.SizePixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}